

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

uchar * __thiscall
CVmRun::op_overload(CVmRun *this,uint caller_ofs,int asi_lcl,vm_val_t *obj,vm_prop_id_t prop,
                   uint argc,int err)

{
  uint uVar1;
  int iVar2;
  uchar *puVar3;
  vm_val_t *pvVar4;
  ulong uVar5;
  uint uVar6;
  undefined6 in_register_00000082;
  uint argc_local;
  vm_obj_id_t srcobj;
  vm_val_t *obj_local;
  vm_val_t val;
  vm_val_t new_self;
  
  argc_local = argc;
  obj_local = obj;
  if ((((int)CONCAT62(in_register_00000082,prop) != 0) && (obj->typ < VM_CODEOFS)) &&
     ((0x520U >> (obj->typ & (VM_BIFPTR|VM_ENUM)) & 1) != 0)) {
    iVar2 = get_prop_no_eval(&obj_local,prop,&argc_local,&srcobj,&val,&obj_local,&new_self);
    if (iVar2 != 0) {
      if ((val.typ < VM_BIFPTRX) && ((0x20a00U >> (val.typ & (VM_BIFPTR|VM_ENUM)) & 1) != 0)) {
        if (caller_ofs == 0) {
          caller_ofs = 0;
        }
        else {
          uVar5 = (ulong)argc_local;
          if (asi_lcl < 0) {
            sp_ = sp_ + 1;
            uVar6 = caller_ofs;
            uVar1 = 1;
            if (uVar5 != 0) {
              memmove(sp_ + -uVar5,sp_ + -uVar5 + -1,uVar5 * 0x10);
            }
          }
          else {
            sp_ = sp_ + 2;
            if (uVar5 != 0) {
              memmove(sp_ + -uVar5,sp_ + -uVar5 + -2,uVar5 * 0x10);
            }
            pvVar4 = sp_;
            sp_[-1 - (ulong)(argc_local + 1)].typ = VM_INT;
            pvVar4[-1 - (ulong)(argc_local + 1)].val.obj = caller_ofs;
            uVar6 = asi_lcl;
            uVar1 = 2;
          }
          caller_ofs = uVar1;
          pvVar4 = sp_;
          sp_[-1 - (ulong)argc_local].typ = VM_INT;
          pvVar4[-1 - (ulong)argc_local].val.intval = uVar6;
        }
      }
      puVar3 = eval_prop_val(this,1,caller_ofs,&val,(obj_local->val).obj,prop,obj_local,srcobj,
                             argc_local,(vm_rcdesc *)0x0);
      if ((caller_ofs != 0) &&
         ((VM_OBJX < val.typ || ((0x20a00U >> (val.typ & (VM_BIFPTR|VM_ENUM)) & 1) == 0)))) {
        if (asi_lcl < 0) {
          pvVar4 = sp_;
          sp_ = sp_ + 1;
        }
        else {
          pvVar4 = frame_ptr_ + (uint)asi_lcl;
        }
        *pvVar4 = r0_;
      }
      return puVar3;
    }
  }
  err_throw(err);
}

Assistant:

const uchar *CVmRun::op_overload(VMG_ uint caller_ofs, int asi_lcl,
                                 const vm_val_t *obj, vm_prop_id_t prop,
                                 uint argc, int err)
{
    vm_val_t val;
    vm_obj_id_t srcobj;
    vm_val_t new_self;

    /* 
     *   if the program defines any overloads for the operator, it must
     *   define the export property; so if the export property isn't defined,
     *   we can't have any overloading for the operator 
     */
    if (prop == VM_INVALID_PROP)
        err_throw(err);

    /* 
     *   if the value isn't an object, list, or string, there's no property,
     *   so throw the specified error 
     */
    switch (obj->typ)
    {
    case VM_OBJ:
    case VM_SSTRING:
    case VM_LIST:
        /* these can have property values - look it up */
        if (get_prop_no_eval(vmg_ &obj, prop, &argc, &srcobj, &val,
                             &obj, &new_self))
        {
            /* presume this is not actually a procedure call */
            int is_call = FALSE;
            
            /* 
             *   Got it.  Set up the appropriate special local subroutine for
             *   processing the return value.
             *   
             *   - For a recursive call, the caller will provide the special
             *   handling on return, so there's nothing special to do.
             *   
             *   - If there's no local to assign, we simply push the value
             *   onto the stack on return, then do a local return to the
             *   actual caller.  Push our return offset as the local return
             *   address.
             *   
             *   - If there's a local, we assign the value to the local on
             *   return.  Push the return offset as the local return address,
             *   and push the local number after that.  
             */
            if (val.typ == VM_CODEOFS
                || val.typ == VM_DSTRING
                || val.typ == VM_OBJX)
            {
                /* 
                 *   These will all result in subroutine calls.  Set up the
                 *   return frame patch accordingly. 
                 */
                is_call = TRUE;
                if (caller_ofs == 0)
                {
                    /* 
                     *   this is a recursive call - no return processing
                     *   patch is required 
                     */
                }
                else if (asi_lcl < 0)
                {
                    /* open one stack slot above the arguments */
                    insert(argc, 1);
                    
                    /* on return, push the value onto the stack */
                    get(argc)->set_int(caller_ofs);
                    caller_ofs = VMRUN_RET_OP;
                }
                else
                {
                    /* open two stack slots above the arguments */
                    insert(argc, 2);
                    
                    /* on return, store the value in locl #asi_lcl */
                    get(argc + 1)->set_int(caller_ofs);
                    get(argc)->set_int(asi_lcl);
                    caller_ofs = VMRUN_RET_OP_ASILCL;
                }
            }
                
            /* evaluate the property */
            const uchar *ret = eval_prop_val(
                vmg_ TRUE, caller_ofs, &val, obj->val.obj, prop,
                obj, srcobj, argc, 0);

            /* if this is a direct evaluation, do the return patch now */
            if (!is_call)
            {
                if (caller_ofs == 0)
                {
                    /* recursive call - the caller will take care of it */
                }
                else if (asi_lcl < 0)
                {
                    /* normal operator eval - push the result onto the stack */
                    push(get_r0());
                }
                else
                {
                    /* local assignment on return */
                    *get_local(vmg_ asi_lcl) = *get_r0();
                }
            }

            /* return the result */
            return ret;
        }

        /* the property isn't defined - throw the caller's error */
        err_throw(err);
        AFTER_ERR_THROW(return 0;)

    default:
        /* other types don't have properties - throw the caller's error */
        err_throw(err);
        AFTER_ERR_THROW(return 0;)
    }
}